

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::operator[]
          (optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
           *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          *ab)

{
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  undefined1 local_48 [8];
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> edge_pair;
  pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *ab_local;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> *res;
  
  edge_pair._31_1_ = 0;
  boost::optional<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::optional
            (__return_storage_ptr__);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config>>
            ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> *)
             local_48,(boost *)(long)(ab->first).vertex,(long)(ab->second).vertex,
             (vertex_descriptor)&this->skeleton,in_R8);
  if (((byte)edge_pair.first.m_eproperty & 1) != 0) {
    boost::optional<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>::operator=
              ((optional<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>> *)
               __return_storage_ptr__,
               (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Edge_handle> operator[](
                                          const std::pair<Vertex_handle, Vertex_handle>& ab) const {
    boost::optional<Edge_handle> res;
    std::pair<Edge_handle, bool> edge_pair(
                                           boost::edge(ab.first.vertex, ab.second.vertex, skeleton));
    if (edge_pair.second)
      res = edge_pair.first;
    return res;
  }